

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool alwaysOverwritableFile(QString *fileName)

{
  byte bVar1;
  char *in_RDI;
  QLatin1StringView QVar2;
  QLatin1String QVar3;
  QLatin1String QVar4;
  QLatin1String QVar5;
  QLatin1String QVar6;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *str;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  QVar2 = Qt::Literals::StringLiterals::operator____L1
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  local_18 = (char *)QVar2.m_size;
  QVar3.m_data = local_18;
  QVar3.m_size = (qsizetype)in_RDI;
  bVar1 = QString::endsWith(QVar3,(CaseSensitivity)QVar2.m_data);
  local_49 = 1;
  if ((bVar1 & 1) == 0) {
    QVar2 = Qt::Literals::StringLiterals::operator____L1
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    local_28 = (char *)QVar2.m_size;
    QVar4.m_data = local_28;
    QVar4.m_size = (qsizetype)in_RDI;
    bVar1 = QString::endsWith(QVar4,(CaseSensitivity)QVar2.m_data);
    local_49 = 1;
    if ((bVar1 & 1) == 0) {
      str = in_RDI;
      QVar2 = Qt::Literals::StringLiterals::operator____L1(in_RDI,in_stack_ffffffffffffff90);
      local_38 = (char *)QVar2.m_size;
      QVar5.m_data = local_38;
      QVar5.m_size = (qsizetype)str;
      bVar1 = QString::endsWith(QVar5,(CaseSensitivity)QVar2.m_data);
      local_49 = 1;
      if ((bVar1 & 1) == 0) {
        QVar2 = Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_RDI);
        local_48 = (char *)QVar2.m_size;
        QVar6.m_data = local_48;
        QVar6.m_size = (qsizetype)in_RDI;
        local_49 = QString::endsWith(QVar6,(CaseSensitivity)QVar2.m_data);
      }
    }
  }
  return (bool)(local_49 & 1);
}

Assistant:

bool alwaysOverwritableFile(const QString &fileName)
{
    return (fileName.endsWith("/res/values/libs.xml"_L1)
            || fileName.endsWith("/AndroidManifest.xml"_L1)
            || fileName.endsWith("/res/values/strings.xml"_L1)
            || fileName.endsWith("/src/org/qtproject/qt/android/bindings/QtActivity.java"_L1));
}